

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_parameter.hpp
# Opt level: O0

void __thiscall
ruckig::OutputParameter<3UL,_ruckig::StandardVector>::~OutputParameter
          (OutputParameter<3UL,_ruckig::StandardVector> *this)

{
  OutputParameter<3UL,_ruckig::StandardVector> *this_local;
  
  Trajectory<3UL,_ruckig::StandardVector>::~Trajectory(&this->trajectory);
  return;
}

Assistant:

void resize(size_t dofs) {
        new_position.resize(dofs);
        new_velocity.resize(dofs);
        new_acceleration.resize(dofs);
        new_jerk.resize(dofs);
    }